

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O1

double * __thiscall Disa::Matrix_Sparse::at(Matrix_Sparse *this,size_t *i_row,size_t *i_column)

{
  long lVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  source_location *location;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  const_iterator_element *this_00;
  const_iterator_element iter;
  undefined1 local_190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  const_iterator_element local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined **local_30;
  
  location = (source_location *)
             (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
  lVar1 = (long)(this->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)location;
  if ((lVar1 == 0) || ((lVar1 >> 3) - 1U <= *i_row)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_b0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0018cd60;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
               (Disa *)0x0,(Log_Level)&local_b0,location);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_d0.column_index,(long)local_d0.value);
    std::__cxx11::to_string(&local_f0,*i_row);
    std::operator+(&local_110,"Row index ",&local_f0);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_110," not in range ");
    local_170._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p == paVar4) {
      local_170.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_170.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    }
    else {
      local_170.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    local_170._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    range_row_abi_cxx11_(&local_130,this);
    std::operator+(&local_150,&local_170,&local_130);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_150,".");
    local_190._0_8_ = (pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._0_8_ == paVar4) {
      local_190._16_8_ = paVar4->_M_allocated_capacity;
      local_190._24_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_190._0_8_ = local_190 + 0x10;
    }
    else {
      local_190._16_8_ = paVar4->_M_allocated_capacity;
    }
    local_190._8_8_ = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)local_190._0_8_,local_190._8_8_);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    if (*i_column < this->column_size) {
      lower_bound(&local_d0,this,i_row,i_column);
      if ((__impl *)*i_column == *(__impl **)local_d0.column_index) {
        return local_d0.value;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      local_30 = &PTR_s__workspace_llm4binary_github_lic_0018cd90;
      console_format_abi_cxx11_
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                 (Disa *)0x0,(Log_Level)&local_30,(source_location *)local_d0.column_index);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_190._0_8_,local_190._8_8_);
      std::__cxx11::to_string(&local_50,*i_row);
      std::operator+(&local_b0,"Row, column index ",&local_50);
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_b0,", ");
      local_130._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
      paVar4 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p == paVar4) {
        local_130.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_130.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      }
      else {
        local_130.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      }
      local_130._M_string_length = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::to_string(&local_70,*i_column);
      std::operator+(&local_f0,&local_130,&local_70);
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_f0,"not in range ");
      local_110._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
      paVar4 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == paVar4) {
        local_110.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      }
      local_110._M_string_length = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      range_column_abi_cxx11_(&local_90,this);
      std::operator+(&local_170,&local_110,&local_90);
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_170,".");
      local_150._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
      paVar4 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p == paVar4) {
        local_150.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_150.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      }
      else {
        local_150.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      }
      local_150._M_string_length = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_150._M_dataplus._M_p,local_150._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      this_00 = (const_iterator_element *)local_190;
      goto LAB_0013672b;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_b0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0018cd78;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
               (Disa *)0x0,(Log_Level)&local_b0,location);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_d0.column_index,(long)local_d0.value);
    std::__cxx11::to_string(&local_f0,*i_column);
    std::operator+(&local_110,"Column index ",&local_f0);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_110," not in range ");
    local_170._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p == paVar4) {
      local_170.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_170.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    }
    else {
      local_170.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    local_170._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    range_column_abi_cxx11_(&local_130,this);
    std::operator+(&local_150,&local_170,&local_130);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_150,".");
    local_190._0_8_ = (pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._0_8_ == paVar4) {
      local_190._16_8_ = paVar4->_M_allocated_capacity;
      local_190._24_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_190._0_8_ = local_190 + 0x10;
    }
    else {
      local_190._16_8_ = paVar4->_M_allocated_capacity;
    }
    local_190._8_8_ = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)local_190._0_8_,local_190._8_8_);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  this_00 = &local_d0;
LAB_0013672b:
  std::__cxx11::string::~string((string *)this_00);
  exit(1);
}

Assistant:

[[nodiscard]] const double& Matrix_Sparse::at(const std::size_t& i_row, const std::size_t& i_column) const {
  ASSERT(i_row < size_row(), "Row index " + std::to_string(i_row) + " not in range " + range_row() + ".");
  ASSERT(i_column < size_column(),
         "Column index " + std::to_string(i_column) + " not in range " + range_column() + ".");
  const auto iter = lower_bound(i_row, i_column);
  ASSERT(i_column == iter.i_column(), "Row, column index " + std::to_string(i_row) + ", " + std::to_string(i_column) +
                                      "not in range " + range_column() + ".");
  return *iter;
}